

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall Inline::InsertStatementBoundary(Inline *this,Instr *instrNext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PragmaInstr *this_00;
  PragmaInstr *pragmaInstr;
  Instr *instrNext_local;
  Inline *this_local;
  
  if (this->lastStatementBoundary != (PragmaInstr *)0x0) {
    if ((this->lastStatementBoundary->super_Instr).m_func != instrNext->m_func) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x1060,"(lastStatementBoundary->m_func == instrNext->m_func)",
                         "lastStatementBoundary->m_func == instrNext->m_func");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = IR::PragmaInstr::New
                        (StatementBoundary,this->lastStatementBoundary->m_statementIndex,
                         (this->lastStatementBoundary->super_Instr).m_func);
    IR::Instr::SetByteCodeOffset(&this_00->super_Instr,instrNext);
    IR::Instr::InsertBefore(instrNext,&this_00->super_Instr);
  }
  return;
}

Assistant:

void
Inline::InsertStatementBoundary(IR::Instr * instrNext)
{
    if (lastStatementBoundary)
    {
        Assert(lastStatementBoundary->m_func == instrNext->m_func);
        IR::PragmaInstr * pragmaInstr = IR::PragmaInstr::New(Js::OpCode::StatementBoundary,
            lastStatementBoundary->m_statementIndex,
            lastStatementBoundary->m_func);
        pragmaInstr->SetByteCodeOffset(instrNext);
        instrNext->InsertBefore(pragmaInstr);
    }
}